

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

void Gia_ManAutomTranspose64(word *A)

{
  ulong uVar1;
  int j;
  uint uVar2;
  word m;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = 0xffffffff;
  uVar2 = 0x20;
  while (uVar2 != 0) {
    for (uVar4 = 0; (int)uVar4 < 0x40; uVar4 = uVar4 + uVar2 + 1 & ~uVar2) {
      uVar1 = A[(int)(uVar4 + uVar2)];
      uVar5 = (uVar1 >> (sbyte)uVar2 ^ A[(int)uVar4]) & uVar3;
      A[(int)uVar4] = A[(int)uVar4] ^ uVar5;
      A[(int)(uVar4 + uVar2)] = uVar5 << (sbyte)uVar2 ^ uVar1;
    }
    uVar2 = uVar2 >> 1;
    uVar3 = uVar3 ^ uVar3 << (sbyte)uVar2;
  }
  return;
}

Assistant:

void Gia_ManAutomTranspose64( word A[64] )
{
    int j, k;
    word t, m = 0x00000000FFFFFFFF;
    for ( j = 32; j != 0; j = j >> 1, m = m ^ (m << j) )
    {
        for ( k = 0; k < 64; k = (k + j + 1) & ~j )
        {
            t = (A[k] ^ (A[k+j] >> j)) & m;
            A[k] = A[k] ^ t;
            A[k+j] = A[k+j] ^ (t << j);
        }
    }
}